

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

void __thiscall
glu::SubTypeIterator<glu::IsBasicType>::findNext(SubTypeIterator<glu::IsBasicType> *this)

{
  bool bVar1;
  VarTypeComponent local_6c;
  VarTypeComponent local_64;
  VarTypeComponent local_5c;
  VarTypeComponent local_54;
  DataType local_4c;
  int local_48;
  DataType basicType;
  IsBasicType local_31;
  undefined1 local_30 [8];
  VarType curType;
  VarTypeComponent *curComp;
  SubTypeIterator<glu::IsBasicType> *this_local;
  
  bVar1 = std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::empty
                    (&this->m_path);
  if (!bVar1) {
    curType.m_data._8_8_ =
         std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::back
                   (&this->m_path);
    ((reference)curType.m_data._8_8_)->index = ((reference)curType.m_data._8_8_)->index + 1;
  }
  do {
    getVarType((VarType *)local_30,this->m_type,&this->m_path);
    bVar1 = IsBasicType::operator()(&local_31,(VarType *)local_30);
    if (bVar1) {
      local_48 = 2;
    }
    else {
      bVar1 = VarType::isBasicType((VarType *)local_30);
      if (bVar1) {
        local_4c = VarType::getBasicType((VarType *)local_30);
        bVar1 = isDataTypeMatrix(local_4c);
        if (bVar1) {
          VarTypeComponent::VarTypeComponent(&local_54,MATRIX_COLUMN,0);
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                    (&this->m_path,&local_54);
        }
        else {
          bVar1 = isDataTypeVector(local_4c);
          if (bVar1) {
            VarTypeComponent::VarTypeComponent(&local_5c,VECTOR_COMPONENT,0);
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                      (&this->m_path,&local_5c);
          }
        }
      }
      else {
        bVar1 = VarType::isArrayType((VarType *)local_30);
        if (bVar1) {
          VarTypeComponent::VarTypeComponent(&local_64,ARRAY_ELEMENT,0);
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                    (&this->m_path,&local_64);
        }
        else {
          bVar1 = VarType::isStructType((VarType *)local_30);
          if (bVar1) {
            VarTypeComponent::VarTypeComponent(&local_6c,STRUCT_MEMBER,0);
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::push_back
                      (&this->m_path,&local_6c);
          }
        }
      }
      local_48 = 0;
    }
    VarType::~VarType((VarType *)local_30);
  } while (local_48 == 0);
  return;
}

Assistant:

void SubTypeIterator<IsExpanded>::findNext (void)
{
	if (!m_path.empty())
	{
		// Increment child counter in current level.
		VarTypeComponent& curComp = m_path.back();
		curComp.index += 1;
	}

	for (;;)
	{
		VarType curType = getVarType(*m_type, m_path);

		if (IsExpanded()(curType))
			break;

		// Recurse into child type.
		if (curType.isBasicType())
		{
			DataType basicType = curType.getBasicType();

			if (isDataTypeMatrix(basicType))
				m_path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, 0));
			else if (isDataTypeVector(basicType))
				m_path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, 0));
			else
				DE_ASSERT(false); // Can't expand scalars - IsExpanded() is buggy.
		}
		else if (curType.isArrayType())
			m_path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, 0));
		else if (curType.isStructType())
			m_path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, 0));
		else
			DE_ASSERT(false);
	}
}